

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<unsigned_long>
          (anon_unknown_0 *this,char *s,Parser *parser,unsigned_long *val)

{
  char *pcVar1;
  bool bVar2;
  undefined7 extraout_var;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *extraout_RAX;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  allocator<char> local_e9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  bVar2 = StringToIntegerImpl<unsigned_long>(val,s,0,true);
  plVar4 = (long *)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    if (*val != 0) {
      pcVar3 = s + -1;
      do {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        if (*pcVar1 == '\0') break;
      } while (9 < (int)*pcVar1 - 0x30U);
      plVar4 = (long *)(pcVar3 + -(ulong)(s < pcVar3));
      if ((char)*plVar4 == '-') {
        *val = 0xffffffffffffffff;
        goto LAB_001160c1;
      }
    }
    *(undefined2 *)this = 0;
    goto LAB_0011649c;
  }
  if (*val == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,s,(allocator<char> *)&local_68);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1b4253);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_b8 = *puVar7;
      lStack_b0 = plVar4[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar7;
      local_c8 = (ulong *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_d8 = *plVar4;
      uStack_d0 = puVar5[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar4;
      local_e8 = (long *)*puVar5;
    }
    local_e0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    plVar4 = &local_98;
    local_38[0] = local_98;
    local_48[0] = local_a8;
    if (local_a8 == plVar4) goto LAB_0011649c;
  }
  else {
LAB_001160c1:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,s,&local_e9);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1b4253);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_58 = *plVar6;
      lStack_50 = plVar4[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar6;
      local_68 = (long *)*plVar4;
    }
    local_60 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_98 = *plVar4;
      uStack_90 = puVar5[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8 = (long *)*puVar5;
    }
    local_a0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_b8 = *puVar7;
      lStack_b0 = plVar4[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar7;
      local_c8 = (ulong *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    TypeToIntervalString<unsigned_long>();
    uVar8 = 0xf;
    if (local_c8 != &local_b8) {
      uVar8 = local_b8;
    }
    if (uVar8 < (ulong)(local_80 + local_c0)) {
      uVar8 = 0xf;
      if (local_88 != local_78) {
        uVar8 = local_78[0];
      }
      if (uVar8 < (ulong)(local_80 + local_c0)) goto LAB_001162b3;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
    }
    else {
LAB_001162b3:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88);
    }
    local_e8 = &local_d8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_d8 = *plVar4;
      uStack_d0 = puVar5[3];
    }
    else {
      local_d8 = *plVar4;
      local_e8 = (long *)*puVar5;
    }
    local_e0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    plVar4 = local_38;
    if (local_48[0] == plVar4) goto LAB_0011649c;
  }
  operator_delete(local_48[0],local_38[0] + 1);
  plVar4 = extraout_RAX;
LAB_0011649c:
  return SUB82(plVar4,0);
}

Assistant:

static CheckedError atot(const char *s, Parser &parser, T *val) {
  auto done = atot_scalar(s, val, bool_constant<is_floating_point<T>::value>());
  if (done) return NoError();
  if (0 == *val)
    return parser.Error("invalid number: \"" + std::string(s) + "\"");
  else
    return parser.Error("invalid number: \"" + std::string(s) + "\"" +
                        ", constant does not fit " + TypeToIntervalString<T>());
}